

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O2

bool B000FFReadWriter::isB000FF(ByteVector *hdr)

{
  pointer puVar1;
  bool bVar2;
  string magic;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  puVar1 = (hdr->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,puVar1,puVar1 + 7);
  bVar2 = std::operator==(&local_30,"B000FF\n");
  std::__cxx11::string::~string((string *)&local_30);
  return bVar2;
}

Assistant:

region(const uint8_t *p)
        {
            type= get32le(p+0x0);
            pstart= get32le(p+0x4);
            psize= get32le(p+0x8);
            lsize= get32le(p+0xc);
            blksectors= get32le(p+0x10);
            blkbytes= get32le(p+0x14);
            compact= get32le(p+0x18);
        }